

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

void __thiscall
groundupdbext::FileKeyValueStore::FileKeyValueStore(FileKeyValueStore *this,string *fullpath)

{
  bool bVar1;
  path local_78;
  path local_50;
  string *local_18;
  string *fullpath_local;
  FileKeyValueStore *this_local;
  
  local_18 = fullpath;
  fullpath_local = (string *)this;
  groundupdb::KeyValueStore::KeyValueStore(&this->super_KeyValueStore);
  (this->super_KeyValueStore).super_Store._vptr_Store =
       (_func_int **)&PTR__FileKeyValueStore_002c6928;
  std::make_unique<groundupdbext::FileKeyValueStore::Impl,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mImpl);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_50,fullpath,auto_format);
  bVar1 = std::filesystem::exists(&local_50);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_78,fullpath,auto_format);
    std::filesystem::create_directories(&local_78);
    Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_78);
  }
  return;
}

Assistant:

FileKeyValueStore::FileKeyValueStore(std::string fullpath)
  : mImpl(std::make_unique<FileKeyValueStore::Impl>(fullpath))
{
  if (!fs::exists(fullpath)) {
      fs::create_directories(fullpath);
  }
}